

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

reference __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(identifier_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  bool bVar1;
  __type_conflict1 _Var2;
  int iVar3;
  path_node_type *ppVar4;
  size_t sVar5;
  value_type *pvVar6;
  undefined4 extraout_var;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar7;
  undefined4 extraout_var_00;
  reference pbVar8;
  unsigned_long index;
  supertype *psVar9;
  _func_int **pp_Var10;
  object_iterator oVar11;
  type tVar12;
  string_view_type sVar13;
  int64_t n;
  allocator<char> local_81;
  reference local_80;
  error_code *local_78;
  allocator<char> local_69;
  path_node_type *local_68;
  unsigned_long local_60;
  result_options local_54;
  undefined1 local_50 [16];
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_40;
  bool local_38;
  
  local_68 = last;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(current);
  if (bVar1) {
    local_78 = ec;
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    local_80 = root;
    local_54 = options;
    oVar11 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                       ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)current,
                        (string_view_type *)local_50);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((object_range_type *)local_50,
               (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)current);
    options = local_54;
    if ((((undefined1  [16])oVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_38 & 1U) == 0)) {
      if (oVar11.has_value_ == local_38) goto LAB_0031f5ad;
    }
    else if (oVar11.it_._M_current._M_current == local_40._M_current) goto LAB_0031f5ad;
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ::generate(context,local_68,(string_view_type *)local_50,local_54);
    pvVar6 = &(oVar11.it_._M_current._M_current)->value_;
    psVar9 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar9 == (supertype *)0x0) {
      return pvVar6;
    }
    pp_Var10 = psVar9->_vptr_jsonpath_selector;
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(current);
    if (bVar1) {
      local_60 = 0;
      tVar12 = jsoncons::detail::dec_to_integer<long,char>
                         ((this->identifier_)._M_dataplus._M_p,(this->identifier_)._M_string_length,
                          (long *)&local_60);
      if (tVar12.ec == success) {
        local_78 = ec;
        index = local_60;
        if ((long)local_60 < 0) {
          sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
          index = sVar5 + local_60;
        }
        sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
        if (index < sVar5) {
          local_80 = root;
          ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ::generate(context,local_68,index,options);
          pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             (current,index);
          psVar9 = (this->
                   super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ).tail_;
          if (psVar9 == (supertype *)0x0) {
            return pbVar7;
          }
          iVar3 = (*psVar9->_vptr_jsonpath_selector[3])
                            (psVar9,context,local_80,ppVar4,pbVar7,options,local_78);
          return (reference)CONCAT44(extraout_var_00,iVar3);
        }
LAB_0031f5ad:
        pbVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::null_value(context);
        return pbVar8;
      }
      _Var2 = std::operator==(&this->identifier_,&context->length_label_);
      if ((!_Var2) ||
         (sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current),
         sVar5 == 0)) goto LAB_0031f5ad;
      local_78 = ec;
      local_80 = root;
      local_50._0_8_ =
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
      local_81 = (allocator<char>)0x0;
      pvVar6 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
               ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                           *)context,(unsigned_long *)local_50,(semantic_tag *)&local_81,&local_69);
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(current);
      if ((!bVar1) || (_Var2 = std::operator==(&this->identifier_,&context->length_label_), !_Var2))
      {
        pbVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::null_value(context);
        return pbVar8;
      }
      local_78 = ec;
      local_80 = root;
      sVar13 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         (current);
      local_60 = unicode_traits::count_codepoints<char>(sVar13._M_str,sVar13._M_len,strict);
      local_50._0_8_ = local_50._0_8_ & 0xffffffffffffff00;
      pvVar6 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
               ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                           *)context,&local_60,local_50,&local_81);
    }
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ::generate(context,local_68,(string_view_type *)local_50,options);
    psVar9 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar9 == (supertype *)0x0) {
      return pvVar6;
    }
    pp_Var10 = psVar9->_vptr_jsonpath_selector;
  }
  iVar3 = (*pp_Var10[3])(psVar9,context,local_80,ppVar4,pvVar6,(ulong)options,local_78);
  return (reference)CONCAT44(extraout_var,iVar3);
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    return this->evaluate_tail(context, root, 
                                               path_generator_type::generate(context, last, identifier_, options),
                                              (*it).value(), options, ec);
                }
                return context.null_value();
            }
            if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        return this->evaluate_tail(context, root, 
                                                   path_generator_type::generate(context, last, index, options),
                                                   current[index], options, ec);
                    }
                    return context.null_value();
                }
                if (identifier_ == context.length_label() && current.size() > 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    return this->evaluate_tail(context, root, 
                                               path_generator_type::generate(context, last, identifier_, options), 
                                               *ptr, 
                                               options, ec);
                }
                return context.null_value();
            }
            if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                return this->evaluate_tail(context, root, 
                                           path_generator_type::generate(context, last, identifier_, options), 
                                           *ptr, options, ec);
            }
            return context.null_value();
        }